

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageFilledArc(gdImagePtr im,int cx,int cy,int w,int h,int s,int e,int color,int style)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int x2;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int y1;
  int y2;
  ulong uVar10;
  int y2_00;
  int iVar11;
  int x1;
  int x2_00;
  bool bVar12;
  gdPoint pts [3];
  gdPoint local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_38;
  
  x2_00 = 0;
  uVar9 = 0x168;
  uVar8 = 0;
  if (s % 0x168 != e % 0x168) {
    uVar2 = e % 0x168;
    if (e < 0x169) {
      uVar2 = e;
    }
    uVar6 = s % 0x168;
    if (s < 0x169) {
      uVar6 = s;
    }
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    uVar6 = (((uVar9 - uVar6) + ((int)uVar6 >> 0x1f)) / 0x168 - ((int)uVar6 >> 0x1f)) * 0x168 +
            uVar6;
    uVar9 = uVar6;
    if ((int)uVar6 < (int)uVar2) {
      uVar9 = uVar2;
    }
    uVar2 = (((uVar9 - uVar2) - (uint)((int)uVar2 < (int)uVar6)) / 0x168 +
            (uint)((int)uVar2 < (int)uVar6)) * 0x168 + uVar2;
    uVar9 = 0x168;
    if (uVar6 != uVar2) {
      uVar9 = uVar2;
    }
    uVar8 = (ulong)uVar6;
    if (uVar6 == uVar2) {
      uVar8 = 0;
    }
  }
  y2 = 0;
  x2 = 0;
  y2_00 = 0;
  iVar7 = (int)uVar8;
  if (iVar7 <= (int)uVar9) {
    local_38 = (long)w;
    iVar4 = 0;
    x2 = 0;
    y2_00 = 0;
    x1 = 0;
    y1 = 0;
    do {
      uVar5 = (ulong)(uint)(((int)uVar8 + (int)(uVar8 / 0x168) * -0x168) * 4);
      uVar3 = *(int *)((long)gdCosT + uVar5) * local_38;
      uVar10 = uVar3 + 0x7ff;
      if (-1 < (long)uVar3) {
        uVar10 = uVar3;
      }
      x2_00 = (int)(uVar10 >> 0xb) + cx;
      uVar3 = (long)*(int *)((long)gdSinT + uVar5) * (long)h;
      uVar10 = uVar3 + 0x7ff;
      if (-1 < (long)uVar3) {
        uVar10 = uVar3;
      }
      y2 = (int)(uVar10 >> 0xb) + cy;
      bVar12 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      iVar11 = y2_00;
      iVar1 = x2;
      if (bVar12) {
        iVar11 = y2;
        iVar1 = x2_00;
      }
      if (!bVar12 && (style & 1U) == 0) {
        if ((style & 2U) == 0) {
          local_58.x = x1;
          local_58.y = y1;
          local_50 = x2_00;
          local_4c = y2;
          local_48 = cx;
          local_44 = cy;
          gdImageFilledPolygon(im,&local_58,3,color);
          iVar1 = x2;
          iVar11 = y2_00;
        }
        else {
          gdImageLine(im,x1,y1,x2_00,y2,color);
          iVar1 = x2;
          iVar11 = y2_00;
        }
      }
      y2_00 = iVar11;
      x2 = iVar1;
      uVar8 = (ulong)((int)uVar8 + 1);
      x1 = x2_00;
      y1 = y2;
    } while (~uVar9 + iVar7 != iVar4);
  }
  if ((style & 1U) == 0) {
    if ((~style & 6U) != 0) {
      return;
    }
    gdImageLine(im,cx,cy,x2_00,y2,color);
    iVar7 = cy;
    x2_00 = x2;
    x2 = cx;
    y2 = y2_00;
  }
  else {
    if ((style & 2U) == 0) {
      local_58.x = x2;
      local_58.y = y2_00;
      local_50 = x2_00;
      local_4c = y2;
      local_48 = cx;
      local_44 = cy;
      gdImageFilledPolygon(im,&local_58,3,color);
      return;
    }
    iVar7 = y2_00;
    if ((style & 4U) != 0) {
      gdImageLine(im,cx,cy,x2_00,y2,color);
      gdImageLine(im,cx,cy,x2,y2_00,color);
    }
  }
  gdImageLine(im,x2,iVar7,x2_00,y2,color);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledArc (gdImagePtr im, int cx, int cy, int w, int h, int s, int e,
									int color, int style)
{
	gdPoint pts[3];
	int i;
	int lx = 0, ly = 0;
	int fx = 0, fy = 0;

	if ((s % 360)  == (e % 360)) {
		s = 0;
		e = 360;
	} else {
		if (s > 360) {
			s = s % 360;
		}

		if (e > 360) {
			e = e % 360;
		}

		while (s < 0) {
			s += 360;
		}

		while (e < s) {
			e += 360;
		}

		if (s == e) {
			s = 0;
			e = 360;
		}
	}

	for (i = s; (i <= e); i++) {
		int x, y;
		x = ((long) gdCosT[i % 360] * (long) w / (2 * 1024)) + cx;
		y = ((long) gdSinT[i % 360] * (long) h / (2 * 1024)) + cy;
		if (i != s) {
			if (!(style & gdChord)) {
				if (style & gdNoFill) {
					gdImageLine (im, lx, ly, x, y, color);
				} else {
					/* This is expensive! */
					pts[0].x = lx;
					pts[0].y = ly;
					pts[1].x = x;
					pts[1].y = y;
					pts[2].x = cx;
					pts[2].y = cy;
					gdImageFilledPolygon (im, pts, 3, color);
				}
			}
		} else {
			fx = x;
			fy = y;
		}
		lx = x;
		ly = y;
	}
	if (style & gdChord) {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
			gdImageLine (im, fx, fy, lx, ly, color);
		} else {
			pts[0].x = fx;
			pts[0].y = fy;
			pts[1].x = lx;
			pts[1].y = ly;
			pts[2].x = cx;
			pts[2].y = cy;
			gdImageFilledPolygon (im, pts, 3, color);
		}
	} else {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
		}
	}
}